

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::python::Generator::FieldReferencingExpression
          (string *__return_storage_ptr__,Generator *this,Descriptor *containing_type,
          FieldDescriptor *field,string *python_dict_name)

{
  LogMessage *pLVar1;
  _Alloc_hider in_stack_fffffffffffffdc8;
  undefined1 local_228 [72];
  SubstituteArg local_1e0;
  SubstituteArg local_1b0;
  SubstituteArg local_180;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  
  if (*(FileDescriptor **)(field + 0x28) != this->file_) {
    internal::LogMessage::LogMessage
              ((LogMessage *)(local_228 + 0x10),LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/python/python_generator.cc"
               ,1000);
    pLVar1 = internal::LogMessage::operator<<
                       ((LogMessage *)(local_228 + 0x10),"CHECK failed: (field.file()) == (file_): "
                       );
    pLVar1 = internal::LogMessage::operator<<(pLVar1,(string *)**(undefined8 **)(field + 0x28));
    pLVar1 = internal::LogMessage::operator<<(pLVar1," vs. ");
    pLVar1 = internal::LogMessage::operator<<(pLVar1,*(string **)this->file_);
    internal::LogFinisher::operator=((LogFinisher *)&local_1e0,pLVar1);
    internal::LogMessage::~LogMessage((LogMessage *)(local_228 + 0x10));
  }
  if (containing_type == (Descriptor *)0x0) {
    anon_unknown_0::ResolveKeyword(__return_storage_ptr__,*(string **)field);
  }
  else {
    ModuleLevelDescriptorName<google::protobuf::Descriptor>
              ((string *)&stack0xfffffffffffffdc8,this,containing_type);
    local_1e0.text_ = (python_dict_name->_M_dataplus)._M_p;
    local_1e0.size_ = (int)python_dict_name->_M_string_length;
    local_60.text_ = (char *)**(undefined8 **)field;
    local_60.size_ = *(int *)(*(undefined8 **)field + 1);
    local_90.text_ = (char *)0x0;
    local_90.size_ = -1;
    local_c0.text_ = (char *)0x0;
    local_c0.size_ = -1;
    local_f0.text_ = (char *)0x0;
    local_f0.size_ = -1;
    local_120.text_ = (char *)0x0;
    local_120.size_ = -1;
    local_150.text_ = (char *)0x0;
    local_150.size_ = -1;
    local_180.text_ = (char *)0x0;
    local_180.size_ = -1;
    local_1b0.text_ = (char *)0x0;
    local_1b0.size_ = -1;
    strings::Substitute_abi_cxx11_
              (__return_storage_ptr__,(strings *)"$0.$1[\'$2\']",local_228 + 0x10,&local_1e0,
               &local_60,&local_90,&local_c0,&local_f0,&local_120,&local_150,&local_180,&local_1b0,
               (SubstituteArg *)in_stack_fffffffffffffdc8._M_p);
    if ((SubstituteArg *)in_stack_fffffffffffffdc8._M_p != (SubstituteArg *)local_228) {
      operator_delete(in_stack_fffffffffffffdc8._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Generator::FieldReferencingExpression(
    const Descriptor* containing_type, const FieldDescriptor& field,
    const std::string& python_dict_name) const {
  // We should only ever be looking up fields in the current file.
  // The only things we refer to from other files are message descriptors.
  GOOGLE_CHECK_EQ(field.file(), file_)
      << field.file()->name() << " vs. " << file_->name();
  if (!containing_type) {
    return ResolveKeyword(field.name());
  }
  return strings::Substitute("$0.$1['$2']",
                             ModuleLevelDescriptorName(*containing_type),
                             python_dict_name, field.name());
}